

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_avx2.c
# Opt level: O2

uint obmc_sad_w4_avx2(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  uVar4 = 0;
  auVar6._8_4_ = 0x800;
  auVar6._0_8_ = 0x80000000800;
  auVar6._12_4_ = 0x800;
  auVar6._16_4_ = 0x800;
  auVar6._20_4_ = 0x800;
  auVar6._24_4_ = 0x800;
  auVar6._28_4_ = 0x800;
  do {
    auVar2 = vpinsrd_avx(ZEXT416(*(uint *)pre),*(undefined4 *)((long)pre + (long)pre_stride),1);
    auVar7 = vlddqu_avx(*(undefined1 (*) [32])mask);
    auVar1 = vlddqu_avx(*(undefined1 (*) [32])wsrc);
    auVar3 = vpmovzxbd_avx2(auVar2);
    auVar7 = vpmaddwd_avx2(auVar3,auVar7);
    auVar7 = vpsubd_avx2(auVar1,auVar7);
    auVar7 = vpabsd_avx2(auVar7);
    auVar7 = vpaddd_avx2(auVar7,auVar6);
    auVar7 = vpsrld_avx2(auVar7,0xc);
    auVar7 = vpaddd_avx2(auVar7,auVar5._0_32_);
    auVar5 = ZEXT3264(auVar7);
    uVar4 = uVar4 + 8;
    pre = (uint8_t *)((long)pre + (long)(pre_stride * 2));
    wsrc = (int32_t *)((long)wsrc + 0x20);
    mask = (int32_t *)((long)mask + 0x20);
  } while (uVar4 < (height & 0x3ffffffeU) << 2);
  auVar2 = vpaddd_avx(auVar7._0_16_,auVar7._16_16_);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  return auVar2._0_4_;
}

Assistant:

static inline unsigned int obmc_sad_w4_avx2(const uint8_t *pre,
                                            const int pre_stride,
                                            const int32_t *wsrc,
                                            const int32_t *mask,
                                            const int height) {
  int n = 0;
  __m256i v_sad_d = _mm256_setzero_si256();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);

  do {
    const __m128i v_p_b_0 = xx_loadl_32(pre);
    const __m128i v_p_b_1 = xx_loadl_32(pre + pre_stride);
    const __m128i v_p_b = _mm_unpacklo_epi32(v_p_b_0, v_p_b_1);
    const __m256i v_m_d = _mm256_lddqu_si256((__m256i *)(mask + n));
    const __m256i v_w_d = _mm256_lddqu_si256((__m256i *)(wsrc + n));

    const __m256i v_p_d = _mm256_cvtepu8_epi32(v_p_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m256i v_pm_d = _mm256_madd_epi16(v_p_d, v_m_d);

    const __m256i v_diff_d = _mm256_sub_epi32(v_w_d, v_pm_d);
    const __m256i v_absdiff_d = _mm256_abs_epi32(v_diff_d);

    // Rounded absolute difference
    const __m256i v_tmp_d = _mm256_add_epi32(v_absdiff_d, v_bias_d);
    const __m256i v_rad_d = _mm256_srli_epi32(v_tmp_d, 12);

    v_sad_d = _mm256_add_epi32(v_sad_d, v_rad_d);

    n += 8;
    pre += pre_stride << 1;
  } while (n < 8 * (height >> 1));

  __m128i v_sad_d_0 = _mm256_castsi256_si128(v_sad_d);
  __m128i v_sad_d_1 = _mm256_extracti128_si256(v_sad_d, 1);
  v_sad_d_0 = _mm_add_epi32(v_sad_d_0, v_sad_d_1);
  return xx_hsum_epi32_si32(v_sad_d_0);
}